

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReferenceCounted.h
# Opt level: O3

void __thiscall
irr::video::COpenGL3MaterialRenderer::COpenGL3MaterialRenderer
          (COpenGL3MaterialRenderer *this,void **vtt,COpenGL3DriverBase *driver,
          IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,s32 userData)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IMaterialRenderer)._vptr_IMaterialRenderer = pp_Var1;
  *(void **)((long)&(this->super_IMaterialRenderer)._vptr_IMaterialRenderer + (long)pp_Var1[-3]) =
       vtt[2];
  *(undefined ***)&(this->super_IMaterialRenderer).field_0x8 =
       &PTR__IMaterialRendererServices_00264be8;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IMaterialRenderer)._vptr_IMaterialRenderer = pp_Var1;
  *(void **)((long)&(this->super_IMaterialRenderer)._vptr_IMaterialRenderer + (long)pp_Var1[-3]) =
       vtt[3];
  *(undefined8 *)&(this->super_IMaterialRenderer).field_0x8 = 0x267938;
  *(COpenGL3DriverBase **)&(this->super_IMaterialRenderer).field_0x10 = driver;
  *(IShaderConstantSetCallBack **)&(this->super_IMaterialRenderer).field_0x18 = callback;
  this->Alpha = false;
  this->Blending = false;
  *(undefined8 *)&this->Program = 0;
  *(undefined8 *)
   ((long)&(this->UniformInfo).m_data.
           super__Vector_base<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UniformInfo).is_sorted = true;
  this->UserData = userData;
  if (baseMaterial != EMT_TRANSPARENT_ALPHA_CHANNEL) {
    if (baseMaterial == EMT_ONETEXTURE_BLEND) {
      this->Blending = true;
      goto LAB_001f956b;
    }
    if (baseMaterial != EMT_TRANSPARENT_VERTEX_ALPHA) goto LAB_001f956b;
  }
  this->Alpha = true;
LAB_001f956b:
  if (callback != (IShaderConstantSetCallBack *)0x0) {
    *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) =
         *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) + 1;
  }
  return;
}

Assistant:

IReferenceCounted() :
			DebugName(0), ReferenceCounter(1)
	{
	}